

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

void __thiscall
spvtools::anon_unknown_0::Disassembler::Disassembler
          (Disassembler *this,AssemblyGrammar *grammar,uint32_t options,NameMapper *name_mapper)

{
  uint32_t options_00;
  AssemblyGrammar *grammar_00;
  ostream *stream;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
  local_48;
  NameMapper *local_28;
  NameMapper *name_mapper_local;
  AssemblyGrammar *pAStack_18;
  uint32_t options_local;
  AssemblyGrammar *grammar_local;
  Disassembler *this_local;
  
  this->print_ = (options & 2) == 2;
  this->nested_indent_ = (options & 0x100) == 0x100;
  this->reorder_blocks_ = (options & 0x200) == 0x200;
  local_28 = name_mapper;
  name_mapper_local._4_4_ = options;
  pAStack_18 = grammar;
  grammar_local = (AssemblyGrammar *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->text_);
  if ((this->print_ & 1U) == 0) {
    out_stream::out_stream(&this->out_,&this->text_);
  }
  else {
    out_stream::out_stream(&this->out_);
  }
  grammar_00 = pAStack_18;
  stream = out_stream::get(&this->out_);
  options_00 = name_mapper_local._4_4_;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
  ::function(&local_48,name_mapper);
  disassemble::InstructionDisassembler::InstructionDisassembler
            (&this->instruction_disassembler_,grammar_00,stream,options_00,&local_48);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
  ::~function(&local_48);
  this->header_ = (bool)(((name_mapper_local._4_4_ & 0x20) == 0x20 ^ 0xffU) & 1);
  this->byte_offset_ = 0;
  this->inserted_decoration_space_ = false;
  this->inserted_debug_space_ = false;
  this->inserted_type_space_ = false;
  ControlFlowGraph::ControlFlowGraph(&this->current_function_cfg_);
  return;
}

Assistant:

Disassembler(const AssemblyGrammar& grammar, uint32_t options,
               NameMapper name_mapper)
      : print_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_PRINT, options)),
        nested_indent_(
            spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NESTED_INDENT, options)),
        reorder_blocks_(
            spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_REORDER_BLOCKS, options)),
        text_(),
        out_(print_ ? out_stream() : out_stream(text_)),
        instruction_disassembler_(grammar, out_.get(), options, name_mapper),
        header_(!spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NO_HEADER, options)),
        byte_offset_(0) {}